

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function-c.cpp
# Opt level: O0

void duckdb_cast_function_set_row_error
               (duckdb_function_info info,char *error,idx_t row,duckdb_vector output)

{
  long in_RCX;
  char *in_RSI;
  long in_RDI;
  Vector *output_vector;
  CCastExecuteInfo *cast_info;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 8),in_RSI);
  if (in_RCX != 0) {
    duckdb::FlatVector::SetNull((Vector *)info,(idx_t)error,row._7_1_);
  }
  return;
}

Assistant:

void duckdb_cast_function_set_row_error(duckdb_function_info info, const char *error, idx_t row, duckdb_vector output) {
	auto &cast_info = *reinterpret_cast<duckdb::CCastExecuteInfo *>(info);
	cast_info.error_message = error;
	if (!output) {
		return;
	}
	auto &output_vector = *reinterpret_cast<duckdb::Vector *>(output);
	duckdb::FlatVector::SetNull(output_vector, row, true);
}